

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::getKey(QPDFObjectHandle *this,string *key)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle QVar3;
  allocator<char> local_a9;
  string local_a8;
  shared_ptr<QPDFObject> local_88;
  shared_ptr<QPDFObject> local_78;
  allocator<char> local_61;
  string local_60;
  uint local_40;
  undefined1 local_30 [8];
  Dictionary dict;
  string *key_local;
  QPDFObjectHandle *this_local;
  
  as_dictionary((QPDFObjectHandle *)local_30,(typed)key);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_30);
  if (bVar1) {
    ::qpdf::BaseDictionary::getKey((BaseDictionary *)this,(string *)local_30);
  }
  local_40 = (uint)bVar1;
  ::qpdf::Dictionary::~Dictionary((Dictionary *)local_30);
  _Var2._M_pi = extraout_RDX;
  if (local_40 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"returning null for attempted key retrieval",&local_61);
    typeWarning((QPDFObjectHandle *)key,"dictionary",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    QTC::TC("qpdf","QPDFObjectHandle dictionary null for getKey",0);
    std::shared_ptr<QPDFObject>::shared_ptr(&local_88,(shared_ptr<QPDFObject> *)key);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
    QPDF_Null::create((QPDF_Null *)&local_78,&local_88,&getKey::msg,&local_a8);
    QPDFObjectHandle(this,&local_78);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_78);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_88);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::getKey(std::string const& key) const
{
    if (auto dict = as_dictionary(strict)) {
        return dict.getKey(key);
    }
    typeWarning("dictionary", "returning null for attempted key retrieval");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary null for getKey");
    static auto constexpr msg = " -> null returned from getting key $VD from non-Dictionary"sv;
    return QPDF_Null::create(obj, msg, "");
}